

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O0

int res(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector resval,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  sunrealtype yp2;
  sunrealtype yp1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  sunrealtype p3;
  sunrealtype p2;
  sunrealtype p1;
  UserData data;
  void *user_data_local;
  N_Vector resval_local;
  N_Vector yp_local;
  N_Vector yy_local;
  sunrealtype t_local;
  
  dVar1 = *user_data;
  dVar2 = *(double *)((long)user_data + 8);
  dVar3 = *(double *)((long)user_data + 0x10);
  dVar4 = **(double **)((long)yy->content + 0x10);
  dVar5 = *(double *)(*(long *)((long)yy->content + 0x10) + 8);
  dVar6 = *(double *)(*(long *)((long)yy->content + 0x10) + 0x10);
  dVar7 = *(double *)(*(long *)((long)yp->content + 0x10) + 8);
  **(double **)((long)resval->content + 0x10) =
       -(dVar2 * dVar5) * dVar6 + dVar1 * dVar4 + **(double **)((long)yp->content + 0x10);
  *(double *)(*(long *)((long)resval->content + 0x10) + 8) =
       dVar3 * dVar5 * dVar5 + dVar2 * dVar5 * dVar6 + -dVar1 * dVar4 + dVar7;
  *(double *)(*(long *)((long)resval->content + 0x10) + 0x10) = (dVar4 + dVar5 + dVar6) - 1.0;
  return 0;
}

Assistant:

static int res(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector resval,
               void* user_data)
{
  UserData data;
  sunrealtype p1, p2, p3;
  sunrealtype y1, y2, y3;
  sunrealtype yp1, yp2;

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  yp1 = Ith(yp, 1);
  yp2 = Ith(yp, 2);

  Ith(resval, 1) = yp1 + p1 * y1 - p2 * y2 * y3;
  Ith(resval, 2) = yp2 - p1 * y1 + p2 * y2 * y3 + p3 * y2 * y2;
  Ith(resval, 3) = y1 + y2 + y3 - ONE;

  return (0);
}